

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

void P_CheckPlayerSprite(AActor *actor,int *spritenum,DVector2 *scale)

{
  userinfo_t *this;
  double dVar1;
  double dVar2;
  player_t *ppVar3;
  FPlayerSkin *pFVar4;
  FPlayerSkin *pFVar5;
  int iVar6;
  int iVar7;
  AActor *pAVar8;
  int *piVar9;
  
  ppVar3 = actor->player;
  this = &ppVar3->userinfo;
  iVar6 = userinfo_t::GetSkin(this);
  if ((iVar6 != 0) && (((actor->flags4).Value & 0x20) == 0)) {
    pAVar8 = AActor::GetDefault(actor);
    pFVar4 = skins;
    dVar1 = (pAVar8->Scale).X;
    dVar2 = (pAVar8->Scale).Y;
    iVar6 = userinfo_t::GetSkin(this);
    scale->X = (pFVar4[iVar6].Scale.X / dVar1) * scale->X;
    pFVar4 = skins;
    iVar6 = userinfo_t::GetSkin(this);
    scale->Y = (pFVar4[iVar6].Scale.Y / dVar2) * scale->Y;
  }
  pFVar4 = skins;
  if (0.75 < ppVar3->crouchfactor || ppVar3->crouchfactor == 0.75) {
    return;
  }
  iVar6 = *spritenum;
  if ((iVar6 == actor->SpawnState->sprite) ||
     (iVar6 == *(int *)&(ppVar3->mo->super_AActor).field_0x4bc)) {
    piVar9 = (int *)&(ppVar3->mo->super_AActor).field_0x4bc;
  }
  else {
    if ((((actor->flags4).Value & 0x20) != 0) ||
       ((iVar7 = userinfo_t::GetSkin(this), pFVar5 = skins, iVar6 != pFVar4[iVar7].sprite &&
        (iVar6 = *spritenum, iVar7 = userinfo_t::GetSkin(this), iVar6 != pFVar5[iVar7].crouchsprite)
        ))) goto LAB_00464138;
    pFVar4 = skins;
    iVar6 = userinfo_t::GetSkin(this);
    piVar9 = &pFVar4[iVar6].crouchsprite;
  }
  if (0 < *piVar9) {
    *spritenum = *piVar9;
    return;
  }
LAB_00464138:
  if ((ppVar3->playerstate != '\x01') &&
     (ppVar3->crouchfactor <= 0.75 && ppVar3->crouchfactor != 0.75)) {
    scale->Y = scale->Y * 0.5;
  }
  return;
}

Assistant:

void P_CheckPlayerSprite(AActor *actor, int &spritenum, DVector2 &scale)
{
	player_t *player = actor->player;
	int crouchspriteno;

	if (player->userinfo.GetSkin() != 0 && !(actor->flags4 & MF4_NOSKIN))
	{
		// Convert from default scale to skin scale.
		DVector2 defscale = actor->GetDefault()->Scale;
		scale.X *= skins[player->userinfo.GetSkin()].Scale.X / defscale.X;
		scale.Y *= skins[player->userinfo.GetSkin()].Scale.Y / defscale.Y;
	}

	// Set the crouch sprite?
	if (player->crouchfactor < 0.75)
	{
		if (spritenum == actor->SpawnState->sprite || spritenum == player->mo->crouchsprite) 
		{
			crouchspriteno = player->mo->crouchsprite;
		}
		else if (!(actor->flags4 & MF4_NOSKIN) &&
				(spritenum == skins[player->userinfo.GetSkin()].sprite ||
				 spritenum == skins[player->userinfo.GetSkin()].crouchsprite))
		{
			crouchspriteno = skins[player->userinfo.GetSkin()].crouchsprite;
		}
		else
		{ // no sprite -> squash the existing one
			crouchspriteno = -1;
		}

		if (crouchspriteno > 0) 
		{
			spritenum = crouchspriteno;
		}
		else if (player->playerstate != PST_DEAD && player->crouchfactor < 0.75)
		{
			scale.Y *= 0.5;
		}
	}
}